

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O1

Ssw_Sat_t * Ssw_SatStart(int fPolarFlip)

{
  Ssw_Sat_t *pSVar1;
  Vec_Int_t *pVVar2;
  int *__s;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  sat_solver *s;
  int local_2c;
  
  pSVar1 = (Ssw_Sat_t *)malloc(0x40);
  pSVar1->pAig = (Aig_Man_t *)0x0;
  *(undefined8 *)&pSVar1->fPolarFlip = 0;
  pSVar1->pSat = (sat_solver *)0x0;
  *(undefined8 *)&pSVar1->nSatVars = 0;
  pSVar1->vSatVars = (Vec_Int_t *)0x0;
  pSVar1->vFanins = (Vec_Ptr_t *)0x0;
  pSVar1->vUsedPis = (Vec_Ptr_t *)0x0;
  *(undefined8 *)&pSVar1->nSolverCalls = 0;
  pSVar1->fPolarFlip = fPolarFlip;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 10000;
  pVVar2->nSize = 0;
  __s = (int *)malloc(40000);
  pVVar2->pArray = __s;
  pVVar2->nSize = 10000;
  if (__s != (int *)0x0) {
    memset(__s,0,40000);
  }
  pSVar1->vSatVars = pVVar2;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pSVar1->vFanins = pVVar3;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  pVVar3->pArray = ppvVar4;
  pSVar1->vUsedPis = pVVar3;
  s = sat_solver_new();
  pSVar1->pSat = s;
  sat_solver_setnvars(s,1000);
  pSVar1->nSatVars = 1;
  local_2c = 3 - (uint)(fPolarFlip == 0);
  sat_solver_addclause(s,&local_2c,(lit *)&stack0xffffffffffffffd8);
  pSVar1->nSatVars = 2;
  if (0 < pVVar2->nSize) {
    *pVVar2->pArray = 1;
    return pSVar1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the SAT manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Sat_t * Ssw_SatStart( int fPolarFlip )
{
    Ssw_Sat_t * p;
    int Lit;
    p = ABC_ALLOC( Ssw_Sat_t, 1 );
    memset( p, 0, sizeof(Ssw_Sat_t) );
    p->pAig          = NULL;
    p->fPolarFlip    = fPolarFlip;
    p->vSatVars      = Vec_IntStart( 10000 );
    p->vFanins       = Vec_PtrAlloc( 100 );
    p->vUsedPis      = Vec_PtrAlloc( 100 );
    p->pSat          = sat_solver_new();
    sat_solver_setnvars( p->pSat, 1000 );
    // var 0 is not used
    // var 1 is reserved for const1 node - add the clause
    p->nSatVars = 1;
    Lit = toLit( p->nSatVars );
    if ( fPolarFlip )
        Lit = lit_neg( Lit );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
//    Ssw_ObjSetSatNum( p, Aig_ManConst1(p->pAig), p->nSatVars++ );
    Vec_IntWriteEntry( p->vSatVars, 0, p->nSatVars++ );
    return p;
}